

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

float * __thiscall
google::protobuf::Reflection::GetRaw<float>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  uint32_t uVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  ulong uVar4;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  uVar4 = *(ulong *)(field + 0x28);
  if ((uVar4 != 0 && ((byte)field[1] & 0x10) != 0) &&
     ((*(int *)(uVar4 + 4) != 1 || ((*(byte *)(*(long *)(uVar4 + 0x20) + 1) & 2) == 0)))) {
    uVar3 = 0;
    if (((byte)field[1] & 0x10) == 0) {
      uVar4 = uVar3;
    }
    if (*(int *)(uVar4 + 4) == 1) {
      uVar3 = (ulong)((*(byte *)(*(long *)(uVar4 + 0x20) + 1) & 2) >> 1);
    }
    if ((char)uVar3 != '\0') {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
                 ,0x5b7);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar2);
      if ((char)uVar3 != '\0') {
        internal::LogMessage::~LogMessage(&local_68);
      }
    }
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)(uVar4 - *(long *)(*(long *)(uVar4 + 0x10) + 0x30) >> 3) *
                              0x33333334 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 4)) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
                 ,0x5c5);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: !schema_.InRealOneof(field) || HasOneofField(message, field): "
                         );
      pLVar2 = internal::LogMessage::operator<<(pLVar2,"Field = ");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,(string *)(*(long *)(field + 8) + 0x20));
      internal::LogFinisher::operator=(&local_a1,pLVar2);
      internal::LogMessage::~LogMessage(&local_a0);
    }
  }
  uVar1 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  return (float *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1);
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!schema_.InRealOneof(field) || HasOneofField(message, field))
      << "Field = " << field->full_name();
  return internal::GetConstRefAtOffset<Type>(message,
                                             schema_.GetFieldOffset(field));
}